

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void __thiscall l2r_l2_svc_fun::Xv(l2r_l2_svc_fun *this,double *v,double *Xv)

{
  int iVar1;
  feature_node **ppfVar2;
  feature_node *local_38;
  feature_node *s;
  feature_node **x;
  int l;
  int i;
  double *Xv_local;
  double *v_local;
  l2r_l2_svc_fun *this_local;
  
  iVar1 = this->prob->l;
  ppfVar2 = this->prob->x;
  for (x._4_4_ = 0; x._4_4_ < iVar1; x._4_4_ = x._4_4_ + 1) {
    local_38 = ppfVar2[x._4_4_];
    Xv[x._4_4_] = 0.0;
    for (; local_38->index != -1; local_38 = local_38 + 1) {
      Xv[x._4_4_] = v[local_38->index + -1] * local_38->value + Xv[x._4_4_];
    }
  }
  return;
}

Assistant:

void l2r_l2_svc_fun::Xv(double *v, double *Xv)
{
	int i;
	int l=prob->l;
	feature_node **x=prob->x;

#ifdef ENABLED_OPENMP
#pragma omp parallel for private(i) schedule(guided)
#endif
	for(i=0;i<l;i++)
	{
		feature_node *s=x[i];
		Xv[i]=0;
		while(s->index!=-1)
		{
			Xv[i]+=v[s->index-1]*s->value;
			s++;
		}
	}
}